

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

PositionMode __thiscall QCss::Declaration::positionValue(Declaration *this)

{
  DeclarationData *pDVar1;
  PositionMode PVar2;
  quint64 qVar3;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->d).d.ptr;
  if (*(ulong *)&(pDVar1->parsed).d.field_0x18 < 4) {
    PVar2 = PositionMode_Unknown;
    if ((pDVar1->values).d.size == 1) {
      ::QVariant::toString();
      qVar3 = findKnownValue((QString *)&local_40,::positions,5);
      PVar2 = (PositionMode)qVar3;
      if ((QArrayData *)local_40.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_40.shared = *(int *)local_40.shared + -1;
        UNLOCK();
        if (*(int *)local_40.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_40.shared,2,0x10);
        }
      }
      ::QVariant::QVariant((QVariant *)&local_40,PVar2);
      ::QVariant::operator=(&((this->d).d.ptr)->parsed,(QVariant *)&local_40);
      ::QVariant::~QVariant((QVariant *)&local_40);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return PVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    PVar2 = ::QVariant::toInt((bool *)&pDVar1->parsed);
    return PVar2;
  }
  __stack_chk_fail();
}

Assistant:

PositionMode Declaration::positionValue() const
{
    if (d->parsed.isValid())
        return static_cast<PositionMode>(d->parsed.toInt());
    if (d->values.size() != 1)
        return PositionMode_Unknown;
    int v = findKnownValue(d->values.at(0).variant.toString(),
                           positions, NumKnownPositionModes);
    d->parsed = v;
    return static_cast<PositionMode>(v);
}